

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.hpp
# Opt level: O0

String __thiscall doctest::detail::getStreamResult(detail *this,ostream *in)

{
  char *in_00;
  string local_38 [32];
  ostream *local_18;
  ostream *in_local;
  
  local_18 = in;
  in_local = (ostream *)this;
  std::__cxx11::ostringstream::str();
  in_00 = (char *)std::__cxx11::string::c_str();
  String::String((String *)this,in_00);
  std::__cxx11::string::~string(local_38);
  return (String)(char *)this;
}

Assistant:

String getStreamResult(std::ostream* in) {
        return static_cast<std::ostringstream*>(in)->str().c_str();
    }